

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdUpdateWitnessStack
              (void *handle,void *create_handle,int stack_type,char *txid,uint32_t vout,
              uint32_t stack_index,char *stack_item)

{
  ConfidentialTransaction *this;
  bool bVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  ScriptWitness *this_00;
  allocator local_102;
  bool is_bitcoin;
  OutPoint local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  void *local_c0;
  int stack_type_local;
  Txid txid_obj;
  ScriptWitness local_90;
  ScriptWitness local_70;
  ScriptWitness local_50;
  
  local_c0 = handle;
  stack_type_local = stack_type;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_100,"TransactionData",(allocator *)&txid_obj);
  cfd::capi::CheckBuffer(create_handle,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  if (stack_item == (char *)0x0) {
    local_100.txid_._vptr_Txid = (_func_int **)0x4fe2f6;
    local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x27b;
    local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdUpdateWitnessStack";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_100,"stack_item is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_100,"Failed to parameter. stack_item is null or empty.",
               (allocator *)&txid_obj);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_100);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_100,txid,(allocator *)&local_d8);
    cfd::core::Txid::Txid(&txid_obj,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    is_bitcoin = false;
    cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
    this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
    if (this == (ConfidentialTransaction *)0x0) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_100,"Invalid handle state. tx is null",(allocator *)&local_d8);
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_100);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (is_bitcoin == true) {
      cfd::core::OutPoint::OutPoint(&local_100,&txid_obj,vout);
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(this,&local_100);
      cfd::core::Txid::~Txid(&local_100.txid_);
      std::__cxx11::string::string((string *)&local_100,stack_item,&local_102);
      cfd::core::ByteData::ByteData((ByteData *)&local_d8,(string *)&local_100);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_50,(Transaction *)this,uVar2,stack_index,(ByteData *)&local_d8);
      this_00 = &local_50;
    }
    else {
      cfd::core::OutPoint::OutPoint(&local_100,&txid_obj,vout);
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xf])(this,&local_100);
      cfd::core::Txid::~Txid(&local_100.txid_);
      if (stack_type == 1) {
        std::__cxx11::string::string((string *)&local_100,stack_item,&local_102);
        cfd::core::ByteData::ByteData((ByteData *)&local_d8,(string *)&local_100);
        cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                  (&local_90,this,uVar2,stack_index,(ByteData *)&local_d8);
        this_00 = &local_90;
      }
      else {
        if (stack_type != 0) {
          local_100.txid_._vptr_Txid = (_func_int **)0x4fe2f6;
          local_100.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x29c;
          local_100.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "CfdUpdateWitnessStack";
          cfd::core::logger::warn<int&>
                    ((CfdSourceLocation *)&local_100,"Invalid stack type[{}]",&stack_type_local);
          pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_100,"Invalid stack type.",(allocator *)&local_d8);
          cfd::core::CfdException::CfdException
                    (pCVar3,kCfdIllegalArgumentError,(string *)&local_100);
          __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
        std::__cxx11::string::string((string *)&local_100,stack_item,&local_102);
        cfd::core::ByteData::ByteData((ByteData *)&local_d8,(string *)&local_100);
        cfd::core::ConfidentialTransaction::SetScriptWitnessStack
                  (&local_70,this,uVar2,stack_index,(ByteData *)&local_d8);
        this_00 = &local_70;
      }
    }
    cfd::core::ScriptWitness::~ScriptWitness(this_00);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
    std::__cxx11::string::~string((string *)&local_100);
    cfd::core::Txid::~Txid(&txid_obj);
    return 0;
  }
  local_100.txid_._vptr_Txid = (_func_int **)0x4fe2f6;
  local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x281;
  local_100.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdUpdateWitnessStack";
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_100,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_100,"Failed to parameter. txid is null or empty.",
             (allocator *)&txid_obj);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_100);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUpdateWitnessStack(
    void* handle, void* create_handle, int stack_type, const char* txid,
    uint32_t vout, uint32_t stack_index, const char* stack_item) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (stack_item == nullptr) {
      warn(CFD_LOG_SOURCE, "stack_item is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack_item is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      uint32_t index = tx->GetTxInIndex(OutPoint(txid_obj, vout));
      tx->SetScriptWitnessStack(index, stack_index, ByteData(stack_item));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      uint32_t index = tx->GetTxInIndex(OutPoint(txid_obj, vout));
      if (stack_type == kCfdTxWitnessStackNormal) {
        tx->SetScriptWitnessStack(index, stack_index, ByteData(stack_item));
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        tx->SetPeginWitnessStack(index, stack_index, ByteData(stack_item));
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}